

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

void Pdr_ManPrintProgress(Pdr_Man_t *p,int fClose,abctime Time)

{
  uint level;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Pdr_Par_t *pPVar5;
  char *pcVar6;
  Vec_Vec_t *pVVar7;
  int iVar8;
  int iVar9;
  
  if (1 < p->vSolvers->nSize) {
    iVar8 = 0;
    iVar1 = Abc_FrameIsBatchMode();
    if (fClose != 0 || iVar1 == 0) {
      iVar1 = 0;
      for (; pVVar7 = p->vClauses, iVar8 < pVVar7->nSize; iVar8 = iVar8 + 1) {
        pVVar4 = Vec_VecEntry(pVVar7,iVar8);
        iVar2 = Abc_Base10Log(pVVar4->nSize + 1);
        iVar1 = iVar1 + iVar2 + 1;
      }
      iVar8 = 0x3c;
      if (0x3c < iVar1) {
        iVar8 = iVar1;
      }
      Abc_Print((int)pVVar7,"%3d :",(ulong)(p->vSolvers->nSize - 1));
      if (iVar8 == 0x3c) {
        iVar1 = 5;
      }
      else {
        Abc_Print((int)pVVar7," ...");
        iVar1 = 9;
      }
      iVar9 = 0;
      for (iVar2 = 0; pVVar7 = p->vClauses, iVar2 < pVVar7->nSize; iVar2 = iVar2 + 1) {
        pVVar4 = Vec_VecEntry(pVVar7,iVar2);
        level = pVVar4->nSize;
        if (iVar9 < iVar8 + -0x3c) {
          iVar3 = Abc_Base10Log(level + 1);
        }
        else {
          Abc_Print(level," %d",(ulong)level);
          iVar3 = Abc_Base10Log(pVVar4->nSize + 1);
          iVar1 = iVar1 + iVar3 + 1;
        }
        iVar9 = iVar9 + iVar3 + 1;
      }
      for (; iVar8 = (int)pVVar7, iVar1 < 0x46; iVar1 = iVar1 + 1) {
        Abc_Print(iVar8," ");
      }
      Abc_Print(iVar8,"%6d",(ulong)(uint)p->nQueMax);
      Abc_Print(iVar8,"%10.2f sec",(double)Time / 1000000.0);
      pPVar5 = p->pPars;
      if (pPVar5->fSolveAll != 0) {
        Abc_Print(iVar8,"  CEX =%4d",(ulong)(uint)pPVar5->nFailOuts);
        pPVar5 = p->pPars;
      }
      if (pPVar5->nTimeOutOne != 0) {
        Abc_Print(iVar8,"  T/O =%3d",(ulong)(uint)pPVar5->nDropOuts);
      }
      pcVar6 = "\r";
      if (fClose != 0) {
        pcVar6 = "\n";
      }
      Abc_Print(iVar8,"%s",pcVar6);
      if (fClose != 0) {
        p->nQueMax = 0;
      }
      fflush(_stdout);
      return;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Pdr_ManPrintProgress( Pdr_Man_t * p, int fClose, abctime Time )
{
    Vec_Ptr_t * vVec;
    int i, ThisSize, Length, LengthStart;
    if ( Vec_PtrSize(p->vSolvers) < 2 )
        return;
    if ( Abc_FrameIsBatchMode() && !fClose )
        return;
    // count the total length of the printout
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    // determine the starting point
    LengthStart = Abc_MaxInt( 0, Length - 60 );
    Abc_Print( 1, "%3d :", Vec_PtrSize(p->vSolvers)-1 );
    ThisSize = 5;
    if ( LengthStart > 0 )
    {
        Abc_Print( 1, " ..." );
        ThisSize += 4;
    }
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
    {
        if ( Length < LengthStart )
        {
            Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
            continue;
        }
        Abc_Print( 1, " %d", Vec_PtrSize(vVec) );
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
        ThisSize += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    }
    for ( i = ThisSize; i < 70; i++ )
        Abc_Print( 1, " " );
    Abc_Print( 1, "%6d", p->nQueMax );
    Abc_Print( 1, "%10.2f sec", 1.0*Time/CLOCKS_PER_SEC );
    if ( p->pPars->fSolveAll )
        Abc_Print( 1, "  CEX =%4d", p->pPars->nFailOuts );
    if ( p->pPars->nTimeOutOne )
        Abc_Print( 1, "  T/O =%3d", p->pPars->nDropOuts );
    Abc_Print( 1, "%s", fClose ? "\n":"\r" );
    if ( fClose )
        p->nQueMax = 0;
    fflush( stdout );
}